

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

ssize_t __thiscall
icu_63::StringTrieBuilder::BranchHeadNode::write
          (BranchHeadNode *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  StringTrieBuilder *builder_local;
  BranchHeadNode *this_local;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  (*(this->next->super_UObject)._vptr_UObject[5])(this->next,plVar4);
  iVar1 = this->length;
  iVar2 = (**(code **)(*plVar4 + 0x60))();
  if (iVar2 < iVar1) {
    (**(code **)(*plVar4 + 0x78))(plVar4,this->length + -1);
    iVar3 = (**(code **)(*plVar4 + 0x90))
                      (plVar4,(int)(this->super_ValueNode).hasValue,(this->super_ValueNode).value,0)
    ;
    (this->super_ValueNode).super_Node.offset = iVar3;
  }
  else {
    iVar3 = (**(code **)(*plVar4 + 0x90))
                      (plVar4,(int)(this->super_ValueNode).hasValue,(this->super_ValueNode).value,
                       this->length + -1);
    (this->super_ValueNode).super_Node.offset = iVar3;
  }
  return (ssize_t)this;
}

Assistant:

void
StringTrieBuilder::BranchHeadNode::write(StringTrieBuilder &builder) {
    next->write(builder);
    if(length<=builder.getMinLinearMatch()) {
        offset=builder.writeValueAndType(hasValue, value, length-1);
    } else {
        builder.write(length-1);
        offset=builder.writeValueAndType(hasValue, value, 0);
    }
}